

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall V2Transport::ProcessReceivedGarbageBytes(V2Transport *this)

{
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  long in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  string_view in_stack_00000010;
  Level in_stack_000000f0;
  long *in_stack_00000100;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  BIP324Cipher *in_stack_ffffffffffffff58;
  RecvState recv_state;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  bool local_61;
  LogFlags in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  Span<const_std::byte> local_40;
  Span<const_std::byte> local_30;
  Span<const_std::byte> local_20;
  undefined1 local_a;
  undefined1 local_9;
  ConstevalFormatString<1U> fmt;
  
  fmt.fmt = *(char **)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff4c,(AnnotatedMixin<std::mutex> *)0x20a4fa);
  local_9 = *(char *)(in_RDI + 0x518) == '\x02';
  inline_assertion_check<false,bool>
            ((bool *)in_stack_ffffffffffffff68,
             (char *)CONCAT17(in_stack_ffffffffffffff67,
                              CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(char *)in_stack_ffffffffffffff50,
             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_a = sVar3 < 0x1010;
  inline_assertion_check<false,bool>
            ((bool *)in_stack_ffffffffffffff68,
             (char *)CONCAT17(in_stack_ffffffffffffff67,
                              CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),(char *)in_stack_ffffffffffffff50,
             (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (0xf < sVar3) {
    local_30 = MakeByteSpan<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_ffffffffffffff58);
    local_20 = Span<const_std::byte>::last
                         ((Span<const_std::byte> *)in_stack_ffffffffffffff58,
                          (size_t)in_stack_ffffffffffffff50);
    local_40 = BIP324Cipher::GetReceiveGarbageTerminator(in_stack_ffffffffffffff58);
    bVar1 = std::ranges::__equal_fn::
            operator()<Span<const_std::byte>,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,&local_20,&local_40);
    if (bVar1) {
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x4e8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff50);
      recv_state = (RecvState)((ulong)in_stack_ffffffffffffff58 >> 0x38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (this_00,CONCAT17(in_stack_ffffffffffffff67,
                                  CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      SetReceiveState((V2Transport *)
                      CONCAT17(in_stack_ffffffffffffff67,
                               CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)),
                      recv_state);
    }
    else {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (sVar3 == 0x100f) {
        uVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                    Trace);
        if ((bool)uVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff68,
                     (char *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff66,
                                                     in_stack_ffffffffffffff60)));
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff68,
                     (char *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff66,
                                                     in_stack_ffffffffffffff60)));
          LogPrintFormatInternal<long>
                    (in_stack_00000010,in_stack_00000000,in_stack_ffffffffffffffbc,
                     in_stack_ffffffffffffffb0,in_stack_000000f0,fmt,in_stack_00000100);
        }
        local_61 = false;
        goto LAB_0020a755;
      }
    }
  }
  local_61 = true;
LAB_0020a755:
  if (*(char **)(in_FS_OFFSET + 0x28) != fmt.fmt) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool V2Transport::ProcessReceivedGarbageBytes() noexcept
{
    AssertLockHeld(m_recv_mutex);
    Assume(m_recv_state == RecvState::GARB_GARBTERM);
    Assume(m_recv_buffer.size() <= MAX_GARBAGE_LEN + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
    if (m_recv_buffer.size() >= BIP324Cipher::GARBAGE_TERMINATOR_LEN) {
        if (std::ranges::equal(MakeByteSpan(m_recv_buffer).last(BIP324Cipher::GARBAGE_TERMINATOR_LEN), m_cipher.GetReceiveGarbageTerminator())) {
            // Garbage terminator received. Store garbage to authenticate it as AAD later.
            m_recv_aad = std::move(m_recv_buffer);
            m_recv_aad.resize(m_recv_aad.size() - BIP324Cipher::GARBAGE_TERMINATOR_LEN);
            m_recv_buffer.clear();
            SetReceiveState(RecvState::VERSION);
        } else if (m_recv_buffer.size() == MAX_GARBAGE_LEN + BIP324Cipher::GARBAGE_TERMINATOR_LEN) {
            // We've reached the maximum length for garbage + garbage terminator, and the
            // terminator still does not match. Abort.
            LogDebug(BCLog::NET, "V2 transport error: missing garbage terminator, peer=%d\n", m_nodeid);
            return false;
        } else {
            // We still need to receive more garbage and/or garbage terminator bytes.
        }
    } else {
        // We have less than GARBAGE_TERMINATOR_LEN (16) bytes, so we certainly need to receive
        // more first.
    }
    return true;
}